

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb_test_helper.c
# Opt level: O2

void test_lookup_errors(int gai_error,int mmdb_error,char *function,char *ip,char *file,
                       char *mode_desc)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/maxminddb_test_helper.c"
                    ,0xbc,(uint)(gai_error == 0),
                    "no getaddrinfo error in call to %s for %s - %s - %s",function,ip,file,mode_desc
                    ,0);
  if (iVar1 == 0) {
    pcVar2 = gai_strerror(gai_error);
    diag("error from call to getaddrinfo for %s - %s",ip,pcVar2);
  }
  iVar1 = ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/maxminddb_test_helper.c"
                    ,0xc9,(uint)(mmdb_error == 0),"no MMDB error in call to %s for %s - %s - %s",
                    function,ip,file,mode_desc,0);
  if (iVar1 != 0) {
    return;
  }
  pcVar2 = MMDB_strerror(mmdb_error);
  diag("MMDB error - %s",pcVar2);
  return;
}

Assistant:

void test_lookup_errors(int gai_error,
                        int mmdb_error,
                        const char *function,
                        const char *ip,
                        const char *file,
                        const char *mode_desc) {

    int is_ok = ok(0 == gai_error,
                   "no getaddrinfo error in call to %s for %s - %s - %s",
                   function,
                   ip,
                   file,
                   mode_desc);

    if (!is_ok) {
        diag("error from call to getaddrinfo for %s - %s",
             ip,
             gai_strerror(gai_error));
    }

    is_ok = ok(0 == mmdb_error,
               "no MMDB error in call to %s for %s - %s - %s",
               function,
               ip,
               file,
               mode_desc);

    if (!is_ok) {
        diag("MMDB error - %s", MMDB_strerror(mmdb_error));
    }
}